

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O3

FT_Error FT_Outline_Decompose(FT_Outline *outline,FT_Outline_Funcs *func_interface,void *user)

{
  int iVar1;
  long lVar2;
  FT_Vector *pFVar3;
  char *pcVar4;
  FT_Error FVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  FT_Vector *pFVar10;
  byte *pbVar11;
  bool bVar12;
  FT_Vector vec;
  FT_Vector v_control;
  FT_Vector v_middle;
  FT_Vector vec_2;
  FT_Vector *local_b0;
  FT_Vector local_a8;
  uint local_8c;
  FT_Vector local_88;
  FT_Vector local_78;
  FT_Vector local_60;
  FT_Outline *local_50;
  long local_48;
  FT_Vector local_40;
  
  FVar5 = 0x14;
  if (outline != (FT_Outline *)0x0) {
    if (func_interface == (FT_Outline_Funcs *)0x0) {
      FVar5 = 6;
    }
    else if (outline->n_contours < 1) {
      FVar5 = 0;
    }
    else {
      lVar2 = func_interface->delta;
      iVar1 = func_interface->shift;
      local_48 = 0;
      uVar9 = 0;
      local_50 = outline;
      while (local_8c = (uint)local_50->contours[local_48], -1 < local_50->contours[local_48]) {
        pFVar3 = local_50->points;
        local_b0 = pFVar3 + local_8c;
        bVar7 = (byte)iVar1;
        pFVar10 = pFVar3 + uVar9;
        local_78.x = (pFVar3[uVar9].x << (bVar7 & 0x3f)) - lVar2;
        local_78.y = (pFVar3[uVar9].y << (bVar7 & 0x3f)) - lVar2;
        pcVar4 = local_50->tags;
        pbVar11 = (byte *)(pcVar4 + uVar9);
        if ((pcVar4[uVar9] & 3U) == 0) {
          local_a8.x = (pFVar3[local_8c].x << (bVar7 & 0x3f)) - lVar2;
          local_a8.y = (pFVar3[local_8c].y << (bVar7 & 0x3f)) - lVar2;
          if ((pcVar4[local_8c] & 3U) == 1) {
            local_b0 = local_b0 + -1;
          }
          else {
            local_a8.x = (local_a8.x + local_78.x) / 2;
            local_a8.y = (local_a8.y + local_78.y) / 2;
          }
          pFVar10 = pFVar10 + -1;
          pbVar11 = pbVar11 + -1;
        }
        else {
          local_a8.x = local_78.x;
          local_a8.y = local_78.y;
          if ((pcVar4[uVar9] & 3U) == 2) break;
        }
        iVar6 = (*func_interface->move_to)(&local_a8,user);
        if (iVar6 != 0) {
          return iVar6;
        }
        while (pFVar10 < local_b0) {
          if ((pbVar11[1] & 3) == 0) {
            local_78.x = (pFVar10[1].x << (bVar7 & 0x3f)) - lVar2;
            local_78.y = (pFVar10[1].y << (bVar7 & 0x3f)) - lVar2;
            if (local_b0 <= pFVar10 + 1) {
LAB_001367a1:
              iVar6 = (*func_interface->conic_to)(&local_78,&local_a8,user);
              goto LAB_001367b6;
            }
            pbVar11 = pbVar11 + 2;
            pFVar10 = pFVar10 + 2;
            while( true ) {
              local_88.x = (pFVar10->x << (bVar7 & 0x3f)) - lVar2;
              local_88.y = (pFVar10->y << (bVar7 & 0x3f)) - lVar2;
              if ((*pbVar11 & 3) != 0) break;
              local_60.x = (local_88.x + local_78.x) / 2;
              local_60.y = (local_88.y + local_78.y) / 2;
              iVar6 = (*func_interface->conic_to)(&local_78,&local_60,user);
              if (iVar6 != 0) goto LAB_00136806;
              local_78.x = local_88.x;
              local_78.y = local_88.y;
              pbVar11 = pbVar11 + 1;
              bVar12 = local_b0 <= pFVar10;
              pFVar10 = pFVar10 + 1;
              if (bVar12) goto LAB_001367a1;
            }
            if ((*pbVar11 & 3) != 1) {
              iVar8 = 7;
              iVar6 = 0;
              goto LAB_00136814;
            }
            iVar6 = (*func_interface->conic_to)(&local_78,&local_88,user);
            if (iVar6 != 0) {
LAB_00136806:
              iVar8 = 10;
LAB_00136814:
              if (iVar8 != 7) {
                return iVar6;
              }
              goto LAB_00136819;
            }
          }
          else if ((pbVar11[1] & 3) == 1) {
            local_88.x = (pFVar10[1].x << (bVar7 & 0x3f)) - lVar2;
            local_88.y = (pFVar10[1].y << (bVar7 & 0x3f)) - lVar2;
            iVar6 = (*func_interface->line_to)(&local_88,user);
            if (iVar6 != 0) {
              return iVar6;
            }
            pbVar11 = pbVar11 + 1;
            pFVar10 = pFVar10 + 1;
          }
          else {
            iVar8 = 7;
            iVar6 = 0;
            if ((local_b0 < pFVar10 + 2) || ((pbVar11[2] & 3) != 2)) goto LAB_00136814;
            local_88.x = (pFVar10[1].x << (bVar7 & 0x3f)) - lVar2;
            local_88.y = (pFVar10[1].y << (bVar7 & 0x3f)) - lVar2;
            local_60.x = (pFVar10[2].x << (bVar7 & 0x3f)) - lVar2;
            local_60.y = (pFVar10[2].y << (bVar7 & 0x3f)) - lVar2;
            if (local_b0 < pFVar10 + 3) {
              iVar6 = (*func_interface->cubic_to)(&local_88,&local_60,&local_a8,user);
              goto LAB_001367b6;
            }
            local_40.x = (pFVar10[3].x << (bVar7 & 0x3f)) - lVar2;
            local_40.y = (pFVar10[3].y << (bVar7 & 0x3f)) - lVar2;
            iVar6 = (*func_interface->cubic_to)(&local_88,&local_60,&local_40,user);
            if (iVar6 != 0) goto LAB_00136806;
            pbVar11 = pbVar11 + 3;
            pFVar10 = pFVar10 + 3;
          }
        }
        iVar6 = (*func_interface->line_to)(&local_a8,user);
LAB_001367b6:
        if (iVar6 != 0) {
          return iVar6;
        }
        uVar9 = local_8c + 1;
        local_48 = local_48 + 1;
        if (local_50->n_contours <= local_48) {
          return 0;
        }
      }
LAB_00136819:
      FVar5 = 0x14;
    }
  }
  return FVar5;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Decompose( FT_Outline*              outline,
                        const FT_Outline_Funcs*  func_interface,
                        void*                    user )
  {
#undef  SCALED
#define SCALED( x )  ( ( (x) < 0 ? -( -(x) << shift )             \
                                 :  (  (x) << shift ) ) - delta )

    FT_Vector   v_last;
    FT_Vector   v_control;
    FT_Vector   v_start;

    FT_Vector*  point;
    FT_Vector*  limit;
    char*       tags;

    FT_Error    error;

    FT_Int   n;         /* index of contour in outline     */
    FT_UInt  first;     /* index of first point in contour */
    FT_Int   tag;       /* current point's state           */

    FT_Int   shift;
    FT_Pos   delta;


    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !func_interface )
      return FT_THROW( Invalid_Argument );

    shift = func_interface->shift;
    delta = func_interface->delta;
    first = 0;

    for ( n = 0; n < outline->n_contours; n++ )
    {
      FT_Int  last;  /* index of last point in contour */


      FT_TRACE5(( "FT_Outline_Decompose: Outline %d\n", n ));

      last = outline->contours[n];
      if ( last < 0 )
        goto Invalid_Outline;
      limit = outline->points + last;

      v_start   = outline->points[first];
      v_start.x = SCALED( v_start.x );
      v_start.y = SCALED( v_start.y );

      v_last   = outline->points[last];
      v_last.x = SCALED( v_last.x );
      v_last.y = SCALED( v_last.y );

      v_control = v_start;

      point = outline->points + first;
      tags  = outline->tags   + first;
      tag   = FT_CURVE_TAG( tags[0] );

      /* A contour cannot start with a cubic control point! */
      if ( tag == FT_CURVE_TAG_CUBIC )
        goto Invalid_Outline;

      /* check first point to determine origin */
      if ( tag == FT_CURVE_TAG_CONIC )
      {
        /* first point is conic control.  Yes, this happens. */
        if ( FT_CURVE_TAG( outline->tags[last] ) == FT_CURVE_TAG_ON )
        {
          /* start at last point if it is on the curve */
          v_start = v_last;
          limit--;
        }
        else
        {
          /* if both first and last points are conic,         */
          /* start at their middle and record its position    */
          /* for closure                                      */
          v_start.x = ( v_start.x + v_last.x ) / 2;
          v_start.y = ( v_start.y + v_last.y ) / 2;

       /* v_last = v_start; */
        }
        point--;
        tags--;
      }

      FT_TRACE5(( "  move to (%.2f, %.2f)\n",
                  v_start.x / 64.0, v_start.y / 64.0 ));
      error = func_interface->move_to( &v_start, user );
      if ( error )
        goto Exit;

      while ( point < limit )
      {
        point++;
        tags++;

        tag = FT_CURVE_TAG( tags[0] );
        switch ( tag )
        {
        case FT_CURVE_TAG_ON:  /* emit a single line_to */
          {
            FT_Vector  vec;


            vec.x = SCALED( point->x );
            vec.y = SCALED( point->y );

            FT_TRACE5(( "  line to (%.2f, %.2f)\n",
                        vec.x / 64.0, vec.y / 64.0 ));
            error = func_interface->line_to( &vec, user );
            if ( error )
              goto Exit;
            continue;
          }

        case FT_CURVE_TAG_CONIC:  /* consume conic arcs */
          v_control.x = SCALED( point->x );
          v_control.y = SCALED( point->y );

        Do_Conic:
          if ( point < limit )
          {
            FT_Vector  vec;
            FT_Vector  v_middle;


            point++;
            tags++;
            tag = FT_CURVE_TAG( tags[0] );

            vec.x = SCALED( point->x );
            vec.y = SCALED( point->y );

            if ( tag == FT_CURVE_TAG_ON )
            {
              FT_TRACE5(( "  conic to (%.2f, %.2f)"
                          " with control (%.2f, %.2f)\n",
                          vec.x / 64.0, vec.y / 64.0,
                          v_control.x / 64.0, v_control.y / 64.0 ));
              error = func_interface->conic_to( &v_control, &vec, user );
              if ( error )
                goto Exit;
              continue;
            }

            if ( tag != FT_CURVE_TAG_CONIC )
              goto Invalid_Outline;

            v_middle.x = ( v_control.x + vec.x ) / 2;
            v_middle.y = ( v_control.y + vec.y ) / 2;

            FT_TRACE5(( "  conic to (%.2f, %.2f)"
                        " with control (%.2f, %.2f)\n",
                        v_middle.x / 64.0, v_middle.y / 64.0,
                        v_control.x / 64.0, v_control.y / 64.0 ));
            error = func_interface->conic_to( &v_control, &v_middle, user );
            if ( error )
              goto Exit;

            v_control = vec;
            goto Do_Conic;
          }

          FT_TRACE5(( "  conic to (%.2f, %.2f)"
                      " with control (%.2f, %.2f)\n",
                      v_start.x / 64.0, v_start.y / 64.0,
                      v_control.x / 64.0, v_control.y / 64.0 ));
          error = func_interface->conic_to( &v_control, &v_start, user );
          goto Close;

        default:  /* FT_CURVE_TAG_CUBIC */
          {
            FT_Vector  vec1, vec2;


            if ( point + 1 > limit                             ||
                 FT_CURVE_TAG( tags[1] ) != FT_CURVE_TAG_CUBIC )
              goto Invalid_Outline;

            point += 2;
            tags  += 2;

            vec1.x = SCALED( point[-2].x );
            vec1.y = SCALED( point[-2].y );

            vec2.x = SCALED( point[-1].x );
            vec2.y = SCALED( point[-1].y );

            if ( point <= limit )
            {
              FT_Vector  vec;


              vec.x = SCALED( point->x );
              vec.y = SCALED( point->y );

              FT_TRACE5(( "  cubic to (%.2f, %.2f)"
                          " with controls (%.2f, %.2f) and (%.2f, %.2f)\n",
                          vec.x / 64.0, vec.y / 64.0,
                          vec1.x / 64.0, vec1.y / 64.0,
                          vec2.x / 64.0, vec2.y / 64.0 ));
              error = func_interface->cubic_to( &vec1, &vec2, &vec, user );
              if ( error )
                goto Exit;
              continue;
            }

            FT_TRACE5(( "  cubic to (%.2f, %.2f)"
                        " with controls (%.2f, %.2f) and (%.2f, %.2f)\n",
                        v_start.x / 64.0, v_start.y / 64.0,
                        vec1.x / 64.0, vec1.y / 64.0,
                        vec2.x / 64.0, vec2.y / 64.0 ));
            error = func_interface->cubic_to( &vec1, &vec2, &v_start, user );
            goto Close;
          }
        }
      }

      /* close the contour with a line segment */
      FT_TRACE5(( "  line to (%.2f, %.2f)\n",
                  v_start.x / 64.0, v_start.y / 64.0 ));
      error = func_interface->line_to( &v_start, user );

    Close:
      if ( error )
        goto Exit;

      first = (FT_UInt)last + 1;
    }

    FT_TRACE5(( "FT_Outline_Decompose: Done\n", n ));
    return FT_Err_Ok;

  Exit:
    FT_TRACE5(( "FT_Outline_Decompose: Error 0x%x\n", error ));
    return error;

  Invalid_Outline:
    return FT_THROW( Invalid_Outline );
  }